

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ze_nullddi.cpp
# Opt level: O0

ze_result_t driver::zeFenceDestroy(ze_fence_handle_t hFence)

{
  ze_pfnFenceDestroy_t pfnDestroy;
  ze_result_t result;
  ze_fence_handle_t hFence_local;
  
  pfnDestroy._4_4_ = ZE_RESULT_SUCCESS;
  if (DAT_0011c570 != (code *)0x0) {
    pfnDestroy._4_4_ = (*DAT_0011c570)(hFence);
  }
  return pfnDestroy._4_4_;
}

Assistant:

__zedlllocal ze_result_t ZE_APICALL
    zeFenceDestroy(
        ze_fence_handle_t hFence                        ///< [in][release] handle of fence object to destroy
        )
    {
        ze_result_t result = ZE_RESULT_SUCCESS;

        // if the driver has created a custom function, then call it instead of using the generic path
        auto pfnDestroy = context.zeDdiTable.Fence.pfnDestroy;
        if( nullptr != pfnDestroy )
        {
            result = pfnDestroy( hFence );
        }
        else
        {
            // generic implementation

        }

        return result;
    }